

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O1

raw_ostream * __thiscall llvm::raw_ostream::operator<<(raw_ostream *this,format_object_base *Fmt)

{
  uint uVar1;
  raw_ostream *prVar2;
  uint *__n;
  char *pcVar3;
  char *N;
  bool bVar4;
  undefined1 local_c8 [8];
  SmallVector<char,_128U> V;
  
  pcVar3 = this->OutBufEnd + -(long)this->OutBufCur;
  N = (char *)0x7f;
  V.super_SmallVectorStorage<char,_128U>.InlineElts._120_8_ = this;
  if ((char *)0x3 < pcVar3) {
    uVar1 = format_object_base::print(Fmt,this->OutBufCur,(uint)pcVar3);
    N = (char *)(ulong)uVar1;
    if (N <= pcVar3) {
      *(long *)(V.super_SmallVectorStorage<char,_128U>.InlineElts._120_8_ + 0x18) =
           (long)(N + *(long *)(V.super_SmallVectorStorage<char,_128U>.InlineElts._120_8_ + 0x18));
      return (raw_ostream *)V.super_SmallVectorStorage<char,_128U>.InlineElts._120_8_;
    }
  }
  __n = &V.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  V.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX = (void *)0x8000000000;
  local_c8 = (undefined1  [8])__n;
  do {
    SmallVectorImpl<char>::resize((SmallVectorImpl<char> *)local_c8,(size_type)N);
    uVar1 = format_object_base::print(Fmt,(char *)local_c8,(uint)N);
    pcVar3 = (char *)(ulong)uVar1;
    bVar4 = N < pcVar3;
    N = pcVar3;
  } while (bVar4);
  prVar2 = (raw_ostream *)
           write((raw_ostream *)V.super_SmallVectorStorage<char,_128U>.InlineElts._120_8_,
                 local_c8._0_4_,pcVar3,(size_t)__n);
  if (local_c8 !=
      (undefined1  [8])
      &V.super_SmallVectorImpl<char>.super_SmallVectorTemplateBase<char,_true>.
       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size) {
    free((void *)local_c8);
  }
  return prVar2;
}

Assistant:

raw_ostream &raw_ostream::operator<<(const format_object_base &Fmt) {
  // If we have more than a few bytes left in our output buffer, try
  // formatting directly onto its end.
  size_t NextBufferSize = 127;
  size_t BufferBytesLeft = OutBufEnd - OutBufCur;
  if (BufferBytesLeft > 3) {
    size_t BytesUsed = Fmt.print(OutBufCur, BufferBytesLeft);

    // Common case is that we have plenty of space.
    if (BytesUsed <= BufferBytesLeft) {
      OutBufCur += BytesUsed;
      return *this;
    }

    // Otherwise, we overflowed and the return value tells us the size to try
    // again with.
    NextBufferSize = BytesUsed;
  }

  // If we got here, we didn't have enough space in the output buffer for the
  // string.  Try printing into a SmallVector that is resized to have enough
  // space.  Iterate until we win.
  SmallVector<char, 128> V;

  while (true) {
    V.resize(NextBufferSize);

    // Try formatting into the SmallVector.
    size_t BytesUsed = Fmt.print(V.data(), NextBufferSize);

    // If BytesUsed fit into the vector, we win.
    if (BytesUsed <= NextBufferSize)
      return write(V.data(), BytesUsed);

    // Otherwise, try again with a new size.
    assert(BytesUsed > NextBufferSize && "Didn't grow buffer!?");
    NextBufferSize = BytesUsed;
  }
}